

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void ecmult_const_check_result(secp256k1_ge *A,secp256k1_scalar *q,secp256k1_gej *res)

{
  int iVar1;
  secp256k1_ge res2;
  secp256k1_gej res2j;
  secp256k1_gej pointj;
  secp256k1_scalar *in_stack_000006b8;
  secp256k1_scalar *in_stack_000006c0;
  secp256k1_gej *in_stack_000006c8;
  secp256k1_gej *in_stack_000006d0;
  secp256k1_ge *in_stack_fffffffffffffe88;
  secp256k1_gej *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffed8;
  secp256k1_ge *in_stack_fffffffffffffee0;
  secp256k1_ge *in_stack_ffffffffffffff08;
  secp256k1_gej *in_stack_ffffffffffffff10;
  
  secp256k1_gej_set_ge(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  secp256k1_ecmult(in_stack_000006d0,in_stack_000006c8,in_stack_000006c0,in_stack_000006b8);
  secp256k1_ge_set_gej(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  iVar1 = secp256k1_gej_eq_ge_var(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1175,"test condition failed: secp256k1_gej_eq_ge_var(res, &res2)");
    abort();
  }
  return;
}

Assistant:

static void ecmult_const_check_result(const secp256k1_ge *A, const secp256k1_scalar* q, const secp256k1_gej *res) {
    secp256k1_gej pointj, res2j;
    secp256k1_ge res2;
    secp256k1_gej_set_ge(&pointj, A);
    secp256k1_ecmult(&res2j, &pointj, q, &secp256k1_scalar_zero);
    secp256k1_ge_set_gej(&res2, &res2j);
    CHECK(secp256k1_gej_eq_ge_var(res, &res2));
}